

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O2

bool testing::internal::UnitTestOptions::MatchesFilter(string *name_str,char *filter)

{
  bool bVar1;
  UnitTestFilter local_90;
  string local_40;
  allocator<char> local_19;
  
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_40,filter,&local_19);
  anon_unknown_28::UnitTestFilter::UnitTestFilter(&local_90,&local_40);
  bVar1 = anon_unknown_28::UnitTestFilter::MatchesName(&local_90,name_str);
  anon_unknown_28::UnitTestFilter::~UnitTestFilter(&local_90);
  std::__cxx11::string::~string((string *)&local_40);
  return bVar1;
}

Assistant:

bool UnitTestOptions::MatchesFilter(const std::string& name_str,
                                    const char* filter) {
  return UnitTestFilter(filter).MatchesName(name_str);
}